

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_column.h
# Opt level: O2

bool Gudhi::persistence_matrix::operator==
               (Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
                *c1,Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
                    *c2)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  bool bVar4;
  bool bVar5;
  
  if (c1 == c2) {
    return true;
  }
  if ((c1->column_)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      (c2->column_)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    p_Var2 = (c1->column_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var3 = (c2->column_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar4 = (_Rb_tree_header *)p_Var2 == &(c1->column_)._M_t._M_impl.super__Rb_tree_header,
        bVar5 = (_Rb_tree_header *)p_Var3 == &(c2->column_)._M_t._M_impl.super__Rb_tree_header,
        bVar1 = bVar5 || bVar4, !bVar5 && !bVar4;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      if ((*(int **)(p_Var2 + 1))[1] != (*(int **)(p_Var3 + 1))[1]) {
        return bVar1;
      }
      if (**(int **)(p_Var2 + 1) != **(int **)(p_Var3 + 1)) {
        return bVar1;
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator==(const Set_column& c1, const Set_column& c2) {
    if (&c1 == &c2) return true;

    auto it1 = c1.column_.begin();
    auto it2 = c2.column_.begin();
    if (c1.column_.size() != c2.column_.size()) return false;
    while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
      if constexpr (Master_matrix::Option_list::is_z2) {
        if ((*it1)->get_row_index() != (*it2)->get_row_index()) return false;
      } else {
        if ((*it1)->get_row_index() != (*it2)->get_row_index() || (*it1)->get_element() != (*it2)->get_element())
          return false;
      }
      ++it1;
      ++it2;
    }
    return true;
  }